

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

void Fxch_ManDivDoubleCube(Fxch_Man_t *pFxchMan,int iCube,int fAdd,int fUpdate)

{
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int iVar4;
  uint iLit0;
  uint uVar5;
  char fUpdate_00;
  uint iLit1;
  uint uVar6;
  char fAdd_00;
  
  p = pFxchMan->vLitHashKeys;
  p_00 = Vec_WecEntry(pFxchMan->vCubes,iCube);
  uVar5 = 0;
  for (iVar4 = 1; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(p_00,iVar4);
    iVar1 = Vec_IntEntry(p,iVar1);
    uVar5 = uVar5 + iVar1;
  }
  fUpdate_00 = (char)fUpdate;
  fAdd_00 = (char)fAdd;
  Fxch_ManSCAddRemove(pFxchMan,uVar5,iCube,0,0,fAdd_00,fUpdate_00);
  uVar6 = 2;
  for (iLit0 = 1; (int)iLit0 < p_00->nSize; iLit0 = iLit0 + 1) {
    iVar1 = Vec_IntEntry(p_00,iLit0);
    iVar4 = Vec_IntEntry(p,iVar1);
    uVar5 = uVar5 - iVar4;
    iVar4 = Fxch_ManSCAddRemove(pFxchMan,uVar5,iCube,iLit0,0,fAdd_00,fUpdate_00);
    pFxchMan->nPairsD = pFxchMan->nPairsD + iVar4;
    iVar4 = p_00->nSize;
    iLit1 = uVar6;
    if (2 < iVar4) {
      for (; (int)iLit1 < iVar4; iLit1 = iLit1 + 1) {
        iVar4 = Vec_IntEntry(p_00,iLit1);
        iVar2 = Vec_IntEntry(p,iVar4);
        iVar3 = Fxch_ManSCAddRemove(pFxchMan,uVar5 - iVar2,iCube,iLit0,iLit1,fAdd_00,fUpdate_00);
        pFxchMan->nPairsD = pFxchMan->nPairsD + iVar3;
        iVar4 = Vec_IntEntry(p,iVar4);
        uVar5 = (uVar5 - iVar2) + iVar4;
        iVar4 = p_00->nSize;
      }
    }
    iVar4 = Vec_IntEntry(p,iVar1);
    uVar5 = uVar5 + iVar4;
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

static inline void Fxch_ManDivDoubleCube( Fxch_Man_t* pFxchMan,
                                          int iCube,
                                          int fAdd,
                                          int fUpdate )
{
    Vec_Int_t* vLitHashKeys = pFxchMan->vLitHashKeys,
             * vCube = Vec_WecEntry( pFxchMan->vCubes, iCube );
    int SubCubeID = 0,
        iLit0,
        Lit0;

    Vec_IntForEachEntryStart( vCube, Lit0, iLit0, 1)
        SubCubeID += Vec_IntEntry( vLitHashKeys, Lit0 );

    Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                         iCube, 0, 0,
                         (char)fAdd, (char)fUpdate );

    Vec_IntForEachEntryStart( vCube, Lit0, iLit0, 1)
    {
        /* 1 Lit remove */
        SubCubeID -= Vec_IntEntry( vLitHashKeys, Lit0 );

        pFxchMan->nPairsD += Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                                                  iCube, iLit0, 0,
                                                  (char)fAdd, (char)fUpdate );

        if ( Vec_IntSize( vCube ) >= 3 )
        {
            int Lit1,
                iLit1;

            Vec_IntForEachEntryStart( vCube, Lit1, iLit1, iLit0 + 1)
            {
                /* 2 Lit remove */
                SubCubeID -= Vec_IntEntry( vLitHashKeys, Lit1 );

                pFxchMan->nPairsD += Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                                                          iCube, iLit0, iLit1,
                                                          (char)fAdd, (char)fUpdate );

                SubCubeID += Vec_IntEntry( vLitHashKeys, Lit1 );
            }
        }

        SubCubeID += Vec_IntEntry( vLitHashKeys, Lit0 );
    }
}